

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
TargetPropertyEntryFinder::operator()(TargetPropertyEntryFinder *this,TargetPropertyEntry *entry)

{
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  _Var1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> locations;
  allocator_type local_39;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> local_20;
  
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandListArgument(&((entry->ge).x_)->Input,&local_38,false);
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::vector
            (&local_20,
             (long)local_38.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_38.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,&local_39);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<cmSourceFileLocation*,std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>,CreateLocation>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_38.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_38.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
              )local_20.
               super__Vector_base<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>.
               _M_impl.super__Vector_impl_data._M_start,this->Needle->Makefile);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<cmSourceFileLocation*,std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>,__gnu_cxx::__ops::_Iter_pred<LocationMatcher>>
                    (local_20.
                     super__Vector_base<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_20.
                     super__Vector_base<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>
                     ._M_impl.super__Vector_impl_data._M_finish,this->Needle);
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::~vector(&local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return _Var1._M_current !=
         local_20.super__Vector_base<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>.
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool operator()(cmTargetInternals::TargetPropertyEntry* entry)
  {
    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry->ge->GetInput(), files);
    std::vector<cmSourceFileLocation> locations(files.size());
    std::transform(files.begin(), files.end(), locations.begin(),
                   CreateLocation(this->Needle.GetMakefile()));

    return std::find_if(locations.begin(), locations.end(),
        LocationMatcher(this->Needle)) != locations.end();
  }